

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O1

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined1 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  ulong local_58;
  
  iVar13 = bottom_blob->dims;
  if (iVar13 == 3) {
    uVar1 = bottom_blob->c;
    uVar12 = bottom_blob->h * bottom_blob->w;
    if (this->bias_term == 0) {
      if (0 < (int)uVar1) {
        local_58 = 0;
        do {
          if (0 < (int)uVar12) {
            sVar4 = bottom_blob->elemsize;
            lVar16 = top_blob->elemsize * top_blob->cstep * local_58;
            pvVar2 = top_blob->data;
            sVar5 = bottom_blob->cstep;
            pvVar3 = bottom_blob->data;
            uVar9 = 0;
            do {
              fVar18 = roundf((float)*(int *)((long)pvVar3 + uVar9 * 4 + sVar4 * sVar5 * local_58) *
                              this->scale_in * this->scale_out);
              iVar6 = (int)fVar18;
              iVar13 = iVar6;
              if (iVar6 < -0x7e) {
                iVar13 = -0x7f;
              }
              if (0x7e < iVar13) {
                iVar13 = 0x7f;
              }
              uVar10 = (undefined1)iVar13;
              *(undefined1 *)((long)pvVar2 + uVar9 + lVar16) = uVar10;
              uVar14 = uVar10;
              if (this->fusion_relu != false) {
                uVar14 = 0;
              }
              if (-1 < iVar6) {
                uVar14 = uVar10;
              }
              *(undefined1 *)((long)pvVar2 + uVar9 + lVar16) = uVar14;
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
          }
          local_58 = local_58 + 1;
        } while (local_58 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        uVar17 = uVar9 & 0xffffffff;
        if (this->bias_data_size < 2) {
          uVar17 = 0;
        }
        if (0 < (int)uVar12) {
          sVar4 = bottom_blob->elemsize;
          fVar18 = *(float *)((long)(this->bias_data).data + uVar17 * 4);
          lVar16 = top_blob->elemsize * top_blob->cstep * uVar9;
          pvVar2 = top_blob->data;
          sVar5 = bottom_blob->cstep;
          pvVar3 = bottom_blob->data;
          uVar17 = 0;
          do {
            fVar19 = roundf(((float)*(int *)((long)pvVar3 + uVar17 * 4 + sVar4 * sVar5 * uVar9) *
                             this->scale_in + fVar18) * this->scale_out);
            uVar8 = (uint)fVar19;
            uVar11 = uVar8;
            if ((int)uVar8 < -0x7e) {
              uVar11 = 0xffffff81;
            }
            if (0x7e < (int)uVar11) {
              uVar11 = 0x7f;
            }
            *(char *)((long)pvVar2 + uVar17 + lVar16) = (char)uVar11;
            uVar15 = (ulong)uVar11;
            if (this->fusion_relu != false) {
              uVar15 = 0;
            }
            uVar14 = (char)uVar15;
            if (-1 < (int)uVar8) {
              uVar14 = (char)uVar11;
            }
            *(undefined1 *)((long)pvVar2 + uVar17 + lVar16) = uVar14;
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
  }
  else if (iVar13 == 2) {
    uVar1 = bottom_blob->w;
    uVar12 = bottom_blob->h;
    if (this->bias_term == 0) {
      if (0 < (int)uVar12) {
        uVar11 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar16 = (long)(int)(top_blob->w * uVar11) * top_blob->elemsize;
            pvVar2 = top_blob->data;
            iVar13 = bottom_blob->w;
            sVar4 = bottom_blob->elemsize;
            pvVar3 = bottom_blob->data;
            uVar9 = 0;
            do {
              fVar18 = roundf((float)*(int *)((long)pvVar3 +
                                             uVar9 * 4 + (long)(int)(iVar13 * uVar11) * sVar4) *
                              this->scale_in * this->scale_out);
              iVar7 = (int)fVar18;
              iVar6 = iVar7;
              if (iVar7 < -0x7e) {
                iVar6 = -0x7f;
              }
              if (0x7e < iVar6) {
                iVar6 = 0x7f;
              }
              uVar10 = (undefined1)iVar6;
              *(undefined1 *)((long)pvVar2 + uVar9 + lVar16) = uVar10;
              uVar14 = uVar10;
              if (this->fusion_relu != false) {
                uVar14 = 0;
              }
              if (-1 < iVar7) {
                uVar14 = uVar10;
              }
              *(undefined1 *)((long)pvVar2 + uVar9 + lVar16) = uVar14;
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar12);
      }
    }
    else if (0 < (int)uVar12) {
      uVar11 = 0;
      do {
        uVar9 = 0;
        if (1 < this->bias_data_size) {
          uVar9 = (ulong)uVar11;
        }
        if (0 < (int)uVar1) {
          lVar16 = (long)(int)(top_blob->w * uVar11) * top_blob->elemsize;
          pvVar2 = top_blob->data;
          iVar13 = bottom_blob->w;
          sVar4 = bottom_blob->elemsize;
          fVar18 = *(float *)((long)(this->bias_data).data + uVar9 * 4);
          pvVar3 = bottom_blob->data;
          uVar9 = 0;
          do {
            fVar19 = roundf(((float)*(int *)((long)pvVar3 +
                                            uVar9 * 4 + (long)(int)(iVar13 * uVar11) * sVar4) *
                             this->scale_in + fVar18) * this->scale_out);
            iVar7 = (int)fVar19;
            iVar6 = iVar7;
            if (iVar7 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            uVar10 = (undefined1)iVar6;
            *(undefined1 *)((long)pvVar2 + uVar9 + lVar16) = uVar10;
            uVar14 = uVar10;
            if (this->fusion_relu != false) {
              uVar14 = 0;
            }
            if (-1 < iVar7) {
              uVar14 = uVar10;
            }
            *(undefined1 *)((long)pvVar2 + uVar9 + lVar16) = uVar14;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar12);
    }
  }
  else if (iVar13 == 1) {
    uVar1 = bottom_blob->w;
    uVar9 = (ulong)uVar1;
    pvVar2 = bottom_blob->data;
    pvVar3 = top_blob->data;
    if (this->bias_term == 0) {
      if (0 < (int)uVar1) {
        uVar17 = 0;
        do {
          fVar18 = roundf((float)*(int *)((long)pvVar2 + uVar17 * 4) * this->scale_in *
                          this->scale_out);
          iVar6 = (int)fVar18;
          iVar13 = iVar6;
          if (iVar6 < -0x7e) {
            iVar13 = -0x7f;
          }
          if (0x7e < iVar13) {
            iVar13 = 0x7f;
          }
          uVar10 = (undefined1)iVar13;
          *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
          uVar14 = uVar10;
          if (this->fusion_relu != false) {
            uVar14 = 0;
          }
          if (-1 < iVar6) {
            uVar14 = uVar10;
          }
          *(undefined1 *)((long)pvVar3 + uVar17) = uVar14;
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
      }
    }
    else if (this->bias_data_size < 2) {
      if (0 < (int)uVar1) {
        fVar18 = *(this->bias_data).data;
        uVar17 = 0;
        do {
          fVar19 = roundf(((float)*(int *)((long)pvVar2 + uVar17 * 4) * this->scale_in + fVar18) *
                          this->scale_out);
          iVar6 = (int)fVar19;
          iVar13 = iVar6;
          if (iVar6 < -0x7e) {
            iVar13 = -0x7f;
          }
          if (0x7e < iVar13) {
            iVar13 = 0x7f;
          }
          uVar10 = (undefined1)iVar13;
          *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
          uVar14 = uVar10;
          if (this->fusion_relu != false) {
            uVar14 = 0;
          }
          if (-1 < iVar6) {
            uVar14 = uVar10;
          }
          *(undefined1 *)((long)pvVar3 + uVar17) = uVar14;
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
      }
    }
    else if (0 < (int)uVar1) {
      uVar17 = 0;
      do {
        fVar18 = roundf(((float)*(int *)((long)pvVar2 + uVar17 * 4) * this->scale_in +
                        *(float *)((long)(this->bias_data).data + uVar17 * 4)) * this->scale_out);
        iVar6 = (int)fVar18;
        iVar13 = iVar6;
        if (iVar6 < -0x7e) {
          iVar13 = -0x7f;
        }
        if (0x7e < iVar13) {
          iVar13 = 0x7f;
        }
        uVar10 = (undefined1)iVar13;
        *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
        uVar14 = uVar10;
        if (this->fusion_relu != false) {
          uVar14 = 0;
        }
        if (-1 < iVar6) {
          uVar14 = uVar10;
        }
        *(undefined1 *)((long)pvVar3 + uVar17) = uVar14;
        uVar17 = uVar17 + 1;
      } while (uVar9 != uVar17);
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{ 
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        const int* intptr = bottom_blob;
        signed char * ptr = top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias_data[i]) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
            else
            {
                float bias = bias_data[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                if (fusion_relu && ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(((intptr[j] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(intptr[j] * scale_in * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;      

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }    
    }

    return 0;
}